

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O3

int auxstatus(lua_State *L,lua_State *co)

{
  int iVar1;
  int iVar2;
  lua_Debug ar;
  lua_Debug local_90;
  
  if (L != co) {
    iVar1 = lua_status(co);
    if (iVar1 == 1) {
      iVar1 = 2;
    }
    else if (iVar1 == 0) {
      iVar2 = lua_getstack(co,0,&local_90);
      iVar1 = 3;
      if (iVar2 == 0) {
        iVar1 = lua_gettop(co);
        iVar1 = 2 - (uint)(iVar1 == 0);
      }
    }
    else {
      iVar1 = 1;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

static int auxstatus (lua_State *L, lua_State *co) {
  if (L == co) return COS_RUN;
  else {
    switch (lua_status(co)) {
      case LUA_YIELD:
        return COS_YIELD;
      case LUA_OK: {
        lua_Debug ar;
        if (lua_getstack(co, 0, &ar))  /* does it have frames? */
          return COS_NORM;  /* it is running */
        else if (lua_gettop(co) == 0)
            return COS_DEAD;
        else
          return COS_YIELD;  /* initial state */
      }
      default:  /* some error occurred */
        return COS_DEAD;
    }
  }
}